

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

int __thiscall mpt::array::set(array *this,value *val)

{
  content *pcVar1;
  iovec *piVar2;
  char *pcVar3;
  type_traits *ptVar4;
  content *pcVar5;
  long lVar6;
  int iVar7;
  uint type;
  size_t sVar8;
  int type_00;
  void *ptr;
  char *local_40;
  size_t local_38;
  
  local_40 = (char *)val->_addr;
  type_00 = (int)val->_type;
  if (type_00 == 0x40) {
    ptVar4 = (type_traits *)0x0;
LAB_0012b070:
    piVar2 = value::vector(val,0);
    if (piVar2 != (iovec *)0x0) {
      local_40 = (char *)piVar2->iov_base;
      sVar8 = piVar2->iov_len;
      local_38 = sVar8;
      goto LAB_0012b0e6;
    }
    local_40 = (char *)0x0;
  }
  else {
    if (type_00 == 0x73) {
      local_40 = value::string(val);
      local_38 = 0;
      if (local_40 == (char *)0x0) {
        sVar8 = 0;
      }
      else {
        local_38 = strlen(local_40);
        sVar8 = local_38 + 1;
      }
LAB_0012b0d9:
      ptVar4 = type_traits::get(99);
      goto LAB_0012b0e6;
    }
    type = type_00 + 0x20U & 0xff;
    if (0x19 < type_00 - 0x40U) {
      type = 0;
    }
    ptVar4 = type_traits::get(type);
    if (ptVar4 != (type_traits *)0x0) goto LAB_0012b070;
    pcVar3 = (char *)mpt_data_tostring(&local_40,(long)type_00,&local_38);
    if (pcVar3 != (char *)0x0) {
      sVar8 = local_38;
      local_40 = pcVar3;
      if (local_38 != 0) {
        sVar8 = (local_38 + 1) - (ulong)(pcVar3[local_38 - 1] == '\0');
      }
      goto LAB_0012b0d9;
    }
    ptVar4 = type_traits::get(type_00);
    if (ptVar4 == (type_traits *)0x0) {
      return -3;
    }
    if (local_40 != (char *)0x0) {
      sVar8 = ptVar4->size;
      local_38 = sVar8;
      goto LAB_0012b0e6;
    }
  }
  sVar8 = 0;
  local_38 = sVar8;
LAB_0012b0e6:
  pcVar5 = (content *)_mpt_buffer_alloc(sVar8,0);
  iVar7 = -4;
  if (pcVar5 != (content *)0x0) {
    *(type_traits **)(pcVar5 + 8) = ptVar4;
    lVar6 = mpt_buffer_set(pcVar5,ptVar4,local_38,local_40,0);
    if ((lVar6 == 0) ||
       ((local_38 < sVar8 && (lVar6 = mpt_buffer_set(pcVar5,ptVar4,1,""), lVar6 == 0)))) {
      (**(code **)(*(long *)pcVar5 + 8))(pcVar5);
    }
    else {
      pcVar1 = (this->_buf)._ref;
      if (pcVar1 != (content *)0x0) {
        (**(code **)(*(long *)pcVar1 + 8))();
      }
      (this->_buf)._ref = pcVar5;
      iVar7 = type_00;
    }
  }
  return iVar7;
}

Assistant:

int array::set(const value &val)
{
	const type_traits *traits = 0;
	size_t len, reserve;
	const int type = val.type();
	const void *ptr = val.data();
	const char *base = 0;
	
	// string data directly
	if (type == 's') {
		ptr = base = val.string();
		len = reserve = 0;
		if (base) {
			len = strlen(base);
			reserve = len + 1;
		}
		traits = type_traits::get('c');
	}
	// get vector data
	else if (type == TypeVector || (traits = type_traits::get(MPT_type_toScalar(type)))) {
		const struct iovec *vec = val.vector(0);
		if (vec) {
			ptr = vec->iov_base;
			len = vec->iov_len;
		} else {
			ptr = 0;
			len = 0;
		}
		reserve = len;
	}
	// try string extraction
	else if ((base = mpt_data_tostring(&ptr, type, &len))) {
		reserve = len && base[len - 1] ? len + 1 : len;
		ptr = base;
		traits = type_traits::get('c');
	}
	// put scalar entity as single array element
	else if ((traits = type_traits::get(type))) {
		len = ptr ? traits->size : 0;
		reserve = len;
	}
	else {
		return BadType;
	}
	// reserve typed buffer content
	buffer *buf = buffer::create(reserve, traits);
	if (!buf) {
		return BadOperation;
	}
	if (!mpt_buffer_set(buf, traits, len, ptr, 0)
	 || ((reserve > len) && !mpt_buffer_set(buf, traits, 1, "", len))) {
		buf->unref();
		return BadOperation;
	}
	_buf.set_instance(static_cast<content *>(buf));
	return type;
}